

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O3

string * __thiscall
zmq::detail::socket_base::get<45,1>(string *__return_storage_ptr__,socket_base *this,char param_3)

{
  pointer optval_;
  char cVar1;
  size_t size;
  pointer local_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,param_3);
  local_20 = (pointer)__return_storage_ptr__->_M_string_length;
  optval_ = local_20;
  if (local_20 != (pointer)0x0) {
    optval_ = (__return_storage_ptr__->_M_dataplus)._M_p;
  }
  get_option(this,0x2d,optval_,(size_t *)&local_20);
  if (local_20 == (pointer)0x0) {
    cVar1 = '\0';
  }
  else {
    if (((__return_storage_ptr__->_M_dataplus)._M_p + -1)[(long)local_20] != '\0') {
      __assert_fail("str[size - 1] == \'\\0\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq.hpp",
                    0x74c,
                    "std::string zmq::detail::socket_base::get(sockopt::array_option<Opt, NullTerm>, size_t) const [Opt = 45, NullTerm = 1]"
                   );
    }
    cVar1 = (char)local_20 + -1;
  }
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,cVar1);
  return __return_storage_ptr__;
}

Assistant:

ZMQ_NODISCARD std::string get(sockopt::array_option<Opt, NullTerm>,
                                  size_t init_size = 1024) const
    {
        if ZMQ_CONSTEXPR_IF (NullTerm == 2) {
            if (init_size == 1024) {
                init_size = 41; // get as Z85 string
            }
        }
        std::string str(init_size, '\0');
        size_t size = get(sockopt::array_option<Opt>{}, buffer(str));
        if ZMQ_CONSTEXPR_IF (NullTerm == 1) {
            if (size > 0) {
                assert(str[size - 1] == '\0');
                --size;
            }
        } else if ZMQ_CONSTEXPR_IF (NullTerm == 2) {
            assert(size == 32 || size == 41);
            if (size == 41) {
                assert(str[size - 1] == '\0');
                --size;
            }
        }
        str.resize(size);
        return str;
    }